

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O1

void __thiscall lsim::ModelWire::simplify(ModelWire *this)

{
  pointer puVar1;
  ModelWireJunction *pMVar2;
  pointer ppMVar3;
  pointer ppMVar4;
  ModelWireSegment *segment;
  ModelWireSegment *segment_00;
  long lVar5;
  unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_> *junction;
  pointer puVar6;
  Point points [3];
  vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_> to_check;
  Point local_68;
  Point local_60;
  Point local_58 [2];
  ModelWireJunction **local_48;
  iterator iStack_40;
  ModelWireJunction **local_38;
  
  local_48 = (ModelWireJunction **)0x0;
  iStack_40._M_current = (ModelWireJunction **)0x0;
  local_38 = (ModelWireJunction **)0x0;
  puVar6 = (this->m_junctions).
           super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_junctions).
           super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar1) {
    do {
      pMVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>
               ._M_t.
               super__Tuple_impl<0UL,_lsim::ModelWireJunction_*,_std::default_delete<lsim::ModelWireJunction>_>
               .super__Head_base<0UL,_lsim::ModelWireJunction_*,_false>._M_head_impl;
      if ((long)*(pointer *)
                 ((long)&(pMVar2->m_segments).
                         super__Vector_base<lsim::ModelWireSegment_*,_std::allocator<lsim::ModelWireSegment_*>_>
                 + 8) -
          *(long *)&(pMVar2->m_segments).
                    super__Vector_base<lsim::ModelWireSegment_*,_std::allocator<lsim::ModelWireSegment_*>_>
                    ._M_impl == 0x10) {
        local_68 = (Point)(puVar6->_M_t).
                          super___uniq_ptr_impl<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_lsim::ModelWireJunction_*,_std::default_delete<lsim::ModelWireJunction>_>
                          .super__Head_base<0UL,_lsim::ModelWireJunction_*,_false>._M_head_impl;
        if (iStack_40._M_current == local_38) {
          std::vector<lsim::ModelWireJunction*,std::allocator<lsim::ModelWireJunction*>>::
          _M_realloc_insert<lsim::ModelWireJunction*>
                    ((vector<lsim::ModelWireJunction*,std::allocator<lsim::ModelWireJunction*>> *)
                     &local_48,iStack_40,(ModelWireJunction **)&local_68);
        }
        else {
          *iStack_40._M_current = (ModelWireJunction *)local_68;
          iStack_40._M_current = iStack_40._M_current + 1;
        }
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  if (local_48 != iStack_40._M_current) {
    do {
      pMVar2 = iStack_40._M_current[-1];
      iStack_40._M_current = iStack_40._M_current + -1;
      ppMVar3 = (pMVar2->m_segments).
                super__Vector_base<lsim::ModelWireSegment_*,_std::allocator<lsim::ModelWireSegment_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppMVar4 = (pMVar2->m_segments).
                super__Vector_base<lsim::ModelWireSegment_*,_std::allocator<lsim::ModelWireSegment_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((ppMVar4 == ppMVar3) || ((ulong)((long)ppMVar4 - (long)ppMVar3) < 9)) {
        __assert_fail("idx < m_segments.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/model_wire.cpp"
                      ,0x20,"ModelWireSegment *lsim::ModelWireJunction::segment(size_t) const");
      }
      segment = *ppMVar3;
      segment_00 = ppMVar3[1];
      local_68 = pMVar2->m_position;
      lVar5 = 8;
      do {
        *(undefined8 *)((long)&local_68.x + lVar5) = 0;
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x18);
      local_60 = (segment->m_ends)._M_elems[(segment->m_ends)._M_elems[0] == pMVar2]->m_position;
      local_58[0] = (segment_00->m_ends)._M_elems[(segment_00->m_ends)._M_elems[0] == pMVar2]->
                    m_position;
      if (ABS((local_58[0].y - local_68.y) * (local_60.x - local_68.x) -
              (local_60.y - local_68.y) * (local_58[0].x - local_68.x)) < 0.001) {
        add_segment(this,&local_60,local_58);
        remove_redundant_segment(this,segment);
        remove_redundant_segment(this,segment_00);
      }
    } while (local_48 != iStack_40._M_current);
  }
  if (local_48 != (ModelWireJunction **)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return;
}

Assistant:

void ModelWire::simplify() {
    // duplicate junctions shouldn't happen because of the way wires are merged. Check not implemented.

    // junctions with just two segments should be removed when the segments are colinear
    std::vector<ModelWireJunction *> to_check;

    for (auto &junction : m_junctions) {
        if (junction->num_segments() == 2) {
            to_check.push_back(junction.get());
        }
    }

    while (!to_check.empty()) {
        auto junction = to_check.back();
        to_check.pop_back();

        ModelWireSegment *segments[2] = {junction->segment(0), junction->segment(1)};

        Point points[3] = {junction->position()};
        points[1] = segments[0]->junction(segments[0]->junction(0) == junction ? 1 : 0)->position();
        points[2] = segments[1]->junction(segments[1]->junction(0) == junction ? 1 : 0)->position();

        if (points_colinear(points[0], points[1], points[2])) {
            add_segment(points[1], points[2]);
            remove_redundant_segment(segments[0]);
            remove_redundant_segment(segments[1]);
        }
    }
}